

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

float make_qp_quants(int n,int nmax,float *x,uint8_t *L,float *quant_weights)

{
  ulong __n;
  uint uVar1;
  int is;
  int iVar2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (0 < n) {
    __n = (ulong)(uint)n;
    fVar6 = 0.0;
    uVar3 = 0;
    do {
      if (fVar6 <= x[uVar3]) {
        fVar6 = x[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      fVar5 = (float)nmax / fVar6;
      fVar7 = 0.0;
      if (0 < n) {
        uVar3 = 0;
        do {
          L[uVar3] = SUB41(x[uVar3] * fVar5 + 12582912.0,0);
          uVar3 = uVar3 + 1;
        } while (__n != uVar3);
        if (0 < n) {
          fVar7 = 0.0;
          uVar3 = 0;
          do {
            fVar8 = (float)L[uVar3] * (-1.0 / fVar5) + x[uVar3];
            fVar7 = fVar7 + quant_weights[uVar3] * fVar8 * fVar8;
            uVar3 = uVar3 + 1;
          } while (__n != uVar3);
        }
      }
      iVar2 = -4;
      do {
        fVar8 = fVar7;
        if (iVar2 != 0) {
          fVar9 = ((float)iVar2 * 0.1 + (float)nmax) / fVar6;
          if (n < 1) {
            fVar10 = 0.0;
          }
          else {
            fVar10 = 0.0;
            uVar3 = 0;
            do {
              iVar4 = ((uint)(fVar9 * x[uVar3] + 12582912.0) & 0x7fffff) - 0x400000;
              if (nmax <= iVar4) {
                iVar4 = nmax;
              }
              fVar8 = (float)iVar4 * (-1.0 / fVar9) + x[uVar3];
              fVar10 = fVar10 + quant_weights[uVar3] * fVar8 * fVar8;
              uVar3 = uVar3 + 1;
            } while (__n != uVar3);
          }
          fVar8 = fVar10;
          if (fVar7 <= fVar10) {
            fVar8 = fVar7;
          }
          fVar5 = (float)(~-(uint)(fVar10 < fVar7) & (uint)fVar5 |
                         (uint)fVar9 & -(uint)(fVar10 < fVar7));
        }
        iVar2 = iVar2 + 1;
        fVar7 = fVar8;
      } while (iVar2 != 5);
      fVar6 = 0.0;
      fVar7 = 0.0;
      if (0 < n) {
        uVar3 = 0;
        do {
          fVar8 = x[uVar3];
          iVar2 = ((uint)(fVar5 * fVar8 + 12582912.0) & 0x7fffff) - 0x400000;
          if (nmax <= iVar2) {
            iVar2 = nmax;
          }
          fVar9 = (float)iVar2;
          L[uVar3] = (uint8_t)iVar2;
          fVar6 = fVar6 + fVar9 * fVar9 * quant_weights[uVar3];
          fVar7 = fVar7 + fVar9 * fVar8 * quant_weights[uVar3];
          uVar3 = uVar3 + 1;
        } while (__n != uVar3);
      }
      iVar2 = 0;
      while (0 < n) {
        uVar3 = 0;
        iVar4 = 0;
        do {
          fVar5 = quant_weights[uVar3];
          fVar8 = x[uVar3];
          fVar10 = (float)L[uVar3];
          fVar9 = fVar6 - fVar10 * fVar10 * fVar5;
          fVar10 = fVar7 - fVar10 * fVar8 * fVar5;
          if ((0.0 < fVar10) && (0.0 < fVar9)) {
            uVar1 = ((uint)((fVar8 * fVar9) / fVar10 + 12582912.0) & 0x7fffff) - 0x400000;
            if (nmax <= (int)uVar1) {
              uVar1 = nmax;
            }
            if (uVar1 != L[uVar3]) {
              fVar9 = (float)(int)uVar1 * fVar5 * (float)(int)uVar1 + fVar9;
              fVar10 = (float)(int)uVar1 * fVar5 * fVar8 + fVar10;
              if (fVar7 * fVar7 * fVar9 < fVar10 * fVar10 * fVar6) {
                L[uVar3] = (uint8_t)uVar1;
                iVar4 = iVar4 + 1;
                fVar6 = fVar9;
                fVar7 = fVar10;
              }
            }
          }
          uVar3 = uVar3 + 1;
        } while (__n != uVar3);
        if ((iVar4 == 0) || (iVar2 = iVar2 + 1, iVar2 == 5)) break;
      }
      return fVar7 / fVar6;
    }
    if (n < 1) {
      return 0.0;
    }
    memset(L,0,__n);
  }
  return 0.0;
}

Assistant:

static float make_qp_quants(int n, int nmax, const float * GGML_RESTRICT x, uint8_t * GGML_RESTRICT L, const float * quant_weights) {
    float max = 0;
    for (int i = 0; i < n; ++i) {
        max = MAX(max, x[i]);
    }
    if (!max) { // all zero
        for (int i = 0; i < n; ++i) { L[i] = 0; }
        return 0.f;
    }
    float iscale = nmax / max;
    for (int i = 0; i < n; ++i) {
        L[i] = nearest_int(iscale * x[i]);
    }
    float scale = 1/iscale;
    float best_mse = 0;
    for (int i = 0; i < n; ++i) {
        float diff = x[i] - scale*L[i];
        float w = quant_weights[i];
        best_mse += w*diff*diff;
    }
    for (int is = -4; is <= 4; ++is) {
        if (is == 0) continue;
        float iscale_is = (0.1f*is + nmax)/max;
        float scale_is = 1/iscale_is;
        float mse = 0;
        for (int i = 0; i < n; ++i) {
            int l = nearest_int(iscale_is*x[i]);
            l = MIN(nmax, l);
            float diff = x[i] - scale_is*l;
            float w = quant_weights[i];
            mse += w*diff*diff;
        }
        if (mse < best_mse) {
            best_mse = mse;
            iscale = iscale_is;
        }
    }
    float sumlx = 0;
    float suml2 = 0;
    for (int i = 0; i < n; ++i) {
        int l = nearest_int(iscale * x[i]);
        l = MIN(nmax, l);
        L[i] = l;
        float w = quant_weights[i];
        sumlx += w*x[i]*l;
        suml2 += w*l*l;
    }
    for (int itry = 0; itry < 5; ++itry) {
        int n_changed = 0;
        for (int i = 0; i < n; ++i) {
            float w = quant_weights[i];
            float slx = sumlx - w*x[i]*L[i];
            float sl2 = suml2 - w*L[i]*L[i];
            if (slx > 0 && sl2 > 0) {
                int new_l = nearest_int(x[i] * sl2 / slx);
                new_l = MIN(nmax, new_l);
                if (new_l != L[i]) {
                    slx += w*x[i]*new_l;
                    sl2 += w*new_l*new_l;
                    if (slx*slx*suml2 > sumlx*sumlx*sl2) {
                        L[i] = new_l; sumlx = slx; suml2 = sl2;
                        ++n_changed;
                    }
                }
            }
        }
        if (!n_changed) {
            break;
        }
    }
    return sumlx/suml2;
}